

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> * __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  
  clear(this);
  uVar1 = other->numAllocated;
  if (uVar1 < 3) {
    sVar2 = other->numActive;
    this->numActive = sVar2;
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      this->items[sVar3].object = other->items[sVar3].object;
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (pool_ref<soul::AST::Expression> *)other->space;
    other->numAllocated = 2;
    other->numActive = 0;
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }